

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O1

string * cppNameOf_abi_cxx11_(string *__return_storage_ptr__,NodePtr *n)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char *pcVar4;
  NodePtr local_20;
  
  switch(n->px->type_) {
  case AVRO_STRING:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "string";
    pcVar3 = "";
    break;
  case AVRO_BYTES:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "bytes";
    pcVar3 = "";
    break;
  case AVRO_INT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "int";
    pcVar3 = "";
    break;
  case AVRO_LONG:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "long";
    pcVar3 = "";
    break;
  case AVRO_FLOAT:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "float";
    pcVar3 = "";
    break;
  case AVRO_DOUBLE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "double";
    pcVar3 = "";
    break;
  case AVRO_BOOL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "bool";
    pcVar3 = "";
    break;
  case AVRO_NULL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "null";
    pcVar3 = "";
    break;
  case AVRO_RECORD:
  case AVRO_ENUM:
  case AVRO_FIXED:
    iVar2 = (*n->px->_vptr_Node[3])();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar1,
               *(long *)(CONCAT44(extraout_var,iVar2) + 0x28) + lVar1);
    return __return_storage_ptr__;
  case AVRO_ARRAY:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "array";
    pcVar3 = "";
    break;
  case AVRO_MAP:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "map";
    pcVar3 = "";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "$Undefined$";
    pcVar3 = "";
    break;
  case AVRO_NUM_TYPES:
    avro::resolveSymbol((avro *)&local_20,n);
    cppNameOf_abi_cxx11_(__return_storage_ptr__,&local_20);
    boost::detail::shared_count::~shared_count(&local_20.pn);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

static string cppNameOf(const NodePtr& n)
{
    switch (n->type()) {
    case avro::AVRO_NULL:
        return "null";
    case avro::AVRO_STRING:
        return "string";
    case avro::AVRO_BYTES:
        return "bytes";
    case avro::AVRO_INT:
        return "int";
    case avro::AVRO_LONG:
        return "long";
    case avro::AVRO_FLOAT:
        return "float";
    case avro::AVRO_DOUBLE:
        return "double";
    case avro::AVRO_BOOL:
        return "bool";
    case avro::AVRO_RECORD:
    case avro::AVRO_ENUM:
    case avro::AVRO_FIXED:
        return decorate(n->name());
    case avro::AVRO_ARRAY:
        return "array";
    case avro::AVRO_MAP:
        return "map";
    case avro::AVRO_SYMBOLIC:
        return cppNameOf(resolveSymbol(n));
    default:
        return "$Undefined$";
    }
}